

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

bool __thiscall
DCanvas::SetTextureParms(DCanvas *this,DrawParms *parms,FTexture *img,double xx,double yy)

{
  double *w;
  double *h;
  double *y;
  int iVar1;
  double dVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (img == (FTexture *)0x0) {
    return false;
  }
  parms->x = xx;
  parms->y = yy;
  dVar6 = (img->Scale).X;
  dVar5 = (double)img->Width / dVar6;
  parms->texwidth = dVar5;
  dVar7 = (img->Scale).Y;
  dVar4 = (double)img->Height / dVar7;
  parms->texheight = dVar4;
  if (((parms->top == 2147483647.0) && (!NAN(parms->top))) || (parms->fortext == true)) {
    uVar3 = (uint)((double)(img->TopOffset * 2) / dVar7);
    parms->top = (double)(int)((uVar3 & 1) + ((int)uVar3 >> 1));
  }
  if (((parms->left == 2147483647.0) && (!NAN(parms->left))) || (parms->fortext == true)) {
    uVar3 = (uint)((double)(img->LeftOffset * 2) / dVar6);
    parms->left = (double)(int)((uVar3 & 1) + ((int)uVar3 >> 1));
  }
  w = &parms->destwidth;
  if (((parms->destwidth == 2147483647.0) && (!NAN(parms->destwidth))) || (parms->fortext == true))
  {
    *w = dVar5;
  }
  h = &parms->destheight;
  if (((parms->destheight == 2147483647.0) && (!NAN(parms->destheight))) || (parms->fortext == true)
     ) {
    *h = dVar4;
  }
  y = &parms->y;
  iVar1 = parms->cleanmode;
  if (iVar1 < 0x400013a6) {
    if (iVar1 == 0x40001390) {
      dVar7 = (double)CleanXfac;
      parms->x = (double)this->Width * 0.5 + (xx + -160.0) * dVar7;
      dVar6 = (double)CleanYfac;
      parms->y = (double)this->Height * 0.5 + (yy + -100.0) * dVar6;
      parms->destwidth = dVar5 * dVar7;
      parms->destheight = dVar4 * dVar6;
      goto LAB_0048df5e;
    }
    if (iVar1 == 0x40001393) {
      *w = dVar5 * (double)CleanXfac;
      dVar7 = (double)CleanYfac;
    }
    else {
      if (iVar1 != 0x40001394) goto LAB_0048df5e;
      *w = dVar5 * (double)CleanXfac_1;
      dVar7 = (double)CleanYfac_1;
    }
  }
  else {
    if (1 < iVar1 + 0xbfffec5aU) {
      if (iVar1 == 0x400013ae) {
        parms->x = 0.0;
        parms->y = 0.0;
      }
      goto LAB_0048df5e;
    }
    if (hud_scale.Value != true) {
      if (iVar1 == 0x400013a7) {
        dVar6 = (double)this->Width * 0.5;
LAB_0048dfc3:
        parms->x = dVar6 + xx;
      }
      else if (xx < 0.0) {
        dVar6 = (double)this->Width;
        goto LAB_0048dfc3;
      }
      if (yy < 0.0) {
        *y = (double)this->Height + yy;
      }
      goto LAB_0048df5e;
    }
    dVar6 = (double)CleanXfac;
    dVar7 = dVar6 * xx;
    parms->x = dVar7;
    if (iVar1 == 0x400013a7) {
      dVar2 = (double)this->Width * 0.5;
LAB_0048df18:
      parms->x = dVar7 + dVar2;
    }
    else if (xx < 0.0) {
      dVar2 = (double)this->Width;
      goto LAB_0048df18;
    }
    dVar7 = (double)CleanYfac;
    *y = yy * dVar7;
    if (yy < 0.0) {
      *y = yy * dVar7 + (double)this->Height;
    }
    *w = dVar5 * dVar6;
  }
  *h = dVar4 * dVar7;
LAB_0048df5e:
  dVar6 = parms->virtWidth;
  if ((dVar6 == (double)this->Width) && (!NAN(dVar6) && !NAN((double)this->Width))) {
    if ((parms->virtHeight == (double)this->Height) &&
       (!NAN(parms->virtHeight) && !NAN((double)this->Height))) {
      return false;
    }
  }
  VirtualToRealCoords(this,&parms->x,y,w,h,dVar6,parms->virtHeight,parms->virtBottom,
                      parms->keepratio == 0);
  return false;
}

Assistant:

bool DCanvas::SetTextureParms(DrawParms *parms, FTexture *img, double xx, double yy) const
{
	if (img != NULL)
	{
		parms->x = xx;
		parms->y = yy;
		parms->texwidth = img->GetScaledWidthDouble();
		parms->texheight = img->GetScaledHeightDouble();
		if (parms->top == INT_MAX || parms->fortext)
		{
			parms->top = img->GetScaledTopOffset();
		}
		if (parms->left == INT_MAX || parms->fortext)
		{
			parms->left = img->GetScaledLeftOffset();
		}
		if (parms->destwidth == INT_MAX || parms->fortext)
		{
			parms->destwidth = img->GetScaledWidthDouble();
		}
		if (parms->destheight == INT_MAX || parms->fortext)
		{
			parms->destheight = img->GetScaledHeightDouble();
		}

		switch (parms->cleanmode)
		{
		default:
			break;

		case DTA_Clean:
			parms->x = (parms->x - 160.0) * CleanXfac + (Width * 0.5);
			parms->y = (parms->y - 100.0) * CleanYfac + (Height * 0.5);
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove:
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove_1:
			parms->destwidth = parms->texwidth * CleanXfac_1;
			parms->destheight = parms->texheight * CleanYfac_1;
			break;

		case DTA_Fullscreen:
			parms->x = parms->y = 0;
			break;

		case DTA_HUDRules:
		case DTA_HUDRulesC:
		{
			bool xright = parms->x < 0;
			bool ybot = parms->y < 0;

			if (hud_scale)
			{
				parms->x *= CleanXfac;
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				parms->y *= CleanYfac;
				if (ybot)
					parms->y = Height + parms->y;
				parms->destwidth = parms->texwidth * CleanXfac;
				parms->destheight = parms->texheight * CleanYfac;
			}
			else
			{
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				if (ybot)
					parms->y = Height + parms->y;
			}
			break;
		}
		}
		if (parms->virtWidth != Width || parms->virtHeight != Height)
		{
			VirtualToRealCoords(parms->x, parms->y, parms->destwidth, parms->destheight,
				parms->virtWidth, parms->virtHeight, parms->virtBottom, !parms->keepratio);
		}
	}

	return false;
}